

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O0

LabelInstr * Peeps::RetargetBrToBr(BranchInstr *branchInstr,LabelInstr *targetInstr)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  BranchInstr *this;
  BranchInstr *this_00;
  Opnd *pOVar6;
  Opnd *pOVar7;
  LabelInstr *pLVar8;
  MultiBranchInstr *this_01;
  MultiBranchInstr *multiBranchInstr;
  LabelInstr *reTargetLabel;
  bool safetofollow;
  BranchInstr *branchAtTarget;
  LabelInstr *lastLoopTop;
  Instr *pIStack_28;
  uint counter;
  Instr *targetInstrNext;
  LabelInstr *targetInstr_local;
  BranchInstr *branchInstr_local;
  
  if (targetInstr == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x31b,"(targetInstr)","targetInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIStack_28 = IR::Instr::GetNextRealInstr(&targetInstr->super_Instr);
  if (pIStack_28 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x31d,"(targetInstrNext)","GetNextRealInstr() failed to get next target");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IR::Instr::IsLowered(&branchInstr->super_Instr);
  branchInstr_local = (BranchInstr *)targetInstr;
  if (bVar2) {
    lastLoopTop._4_4_ = 0;
    branchAtTarget = (BranchInstr *)0x0;
    targetInstrNext = &targetInstr->super_Instr;
    while (bVar2 = IR::Instr::IsBranchInstr(pIStack_28), bVar2) {
      this = IR::Instr::AsBranchInstr(pIStack_28);
      this_00 = IR::Instr::AsBranchInstr(pIStack_28);
      bVar2 = IR::BranchInstr::IsUnconditional(this_00);
      if (!bVar2) {
        bVar2 = false;
        if (pIStack_28->m_opcode == (branchInstr->super_Instr).m_opcode) {
          pOVar6 = IR::Instr::GetSrc1(&branchInstr->super_Instr);
          if ((pOVar6 == (Opnd *)0x0) ||
             (pOVar6 = IR::Instr::GetSrc1(pIStack_28), pOVar6 == (Opnd *)0x0)) {
LAB_0083b6e0:
            pOVar6 = IR::Instr::GetSrc1(&branchInstr->super_Instr);
            if ((pOVar6 != (Opnd *)0x0) ||
               (pOVar6 = IR::Instr::GetSrc1(pIStack_28), pOVar6 != (Opnd *)0x0)) goto LAB_0083b766;
          }
          else {
            pOVar6 = IR::Instr::GetSrc1(&branchInstr->super_Instr);
            pOVar7 = IR::Instr::GetSrc1(pIStack_28);
            bVar3 = IR::Opnd::IsEqual(pOVar6,pOVar7);
            if (!bVar3) goto LAB_0083b6e0;
          }
          pOVar6 = IR::Instr::GetSrc2(&branchInstr->super_Instr);
          if ((pOVar6 == (Opnd *)0x0) ||
             (pOVar6 = IR::Instr::GetSrc2(pIStack_28), pOVar6 == (Opnd *)0x0)) {
LAB_0083b742:
            pOVar6 = IR::Instr::GetSrc2(&branchInstr->super_Instr);
            if ((pOVar6 != (Opnd *)0x0) ||
               (pOVar6 = IR::Instr::GetSrc2(pIStack_28), pOVar6 != (Opnd *)0x0)) goto LAB_0083b766;
          }
          else {
            pOVar6 = IR::Instr::GetSrc2(&branchInstr->super_Instr);
            pOVar7 = IR::Instr::GetSrc2(pIStack_28);
            bVar3 = IR::Opnd::IsEqual(pOVar6,pOVar7);
            if (!bVar3) goto LAB_0083b742;
          }
          bVar2 = true;
        }
LAB_0083b766:
        if (!bVar2) break;
      }
      if ((((ulong)targetInstrNext[1].m_func & 1) != 0) &&
         (bVar2 = IR::Instr::IsLowered(&this->super_Instr), !bVar2)) break;
      if (((ulong)targetInstrNext[1].m_func & 1) != 0) {
        if ((BranchInstr *)targetInstrNext == branchAtTarget) break;
        branchAtTarget = (BranchInstr *)targetInstrNext;
      }
      bVar2 = IR::BranchInstr::IsMultiBranch(branchInstr);
      if (((!bVar2) &&
          (pLVar8 = IR::BranchInstr::GetTarget(branchInstr),
          ((byte)pLVar8->field_0x78 >> 5 & 1) != 0)) &&
         (bVar2 = IR::BranchInstr::IsMultiBranch(this), !bVar2)) {
        pLVar8 = IR::BranchInstr::GetTarget(this);
        pLVar8->field_0x78 = pLVar8->field_0x78 & 0xdf | 0x20;
      }
      lastLoopTop._4_4_ = lastLoopTop._4_4_ + 1;
      if (9999 < lastLoopTop._4_4_) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                           ,0x380,"(++counter < 10000)","We should not be looping this many times!")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pLVar8 = IR::BranchInstr::GetTarget(this);
      if (pLVar8 == (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                           ,900,"(reTargetLabel)","reTargetLabel");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if ((LabelInstr *)targetInstrNext == pLVar8) break;
      bVar2 = IR::BranchInstr::IsMultiBranch(branchInstr);
      if (bVar2) {
        this_01 = IR::BranchInstr::AsMultiBrInstr(branchInstr);
        IR::MultiBranchInstr::ChangeLabelRef(this_01,(LabelInstr *)targetInstrNext,pLVar8);
      }
      else {
        IR::BranchInstr::SetTarget(branchInstr,pLVar8);
      }
      BVar4 = IR::LabelInstr::IsUnreferenced((LabelInstr *)targetInstrNext);
      if (BVar4 != 0) {
        PeepUnreachableLabel((LabelInstr *)targetInstrNext,false,(bool *)0x0);
      }
      pIStack_28 = IR::Instr::GetNextRealInstr(&pLVar8->super_Instr);
      targetInstrNext = &pLVar8->super_Instr;
    }
    branchInstr_local = (BranchInstr *)targetInstrNext;
  }
  return (LabelInstr *)branchInstr_local;
}

Assistant:

IR::LabelInstr *
Peeps::RetargetBrToBr(IR::BranchInstr *branchInstr, IR::LabelInstr * targetInstr)
{
    AnalysisAssert(targetInstr);
    IR::Instr *targetInstrNext = targetInstr->GetNextRealInstr();
    AnalysisAssertMsg(targetInstrNext, "GetNextRealInstr() failed to get next target");

    // Removing branch to branch breaks some lexical assumptions about loop in sccliveness/linearscan/second chance.
    if (!branchInstr->IsLowered())
    {
        return targetInstr;
    }

    //
    // Retarget branch-to-branch
    //
#if DBG
    uint counter = 0;
#endif

    IR::LabelInstr *lastLoopTop = NULL;

    while (true)
    {
        // There's very few cases where we can safely follow a branch chain with intervening instrs.
        // One of them, which comes up occasionally, is where there is a copy of a single-def symbol
        // to another single-def symbol which is only used for the branch instruction (i.e. one dead
        // after the branch). Another is where a single-def symbol is declared of a constant (e.g. a
        // symbol created to store "True"
        // Unfortuantely, to properly do this, we'd need to do it somewhere else (i.e. not in peeps)
        // and make use of the additional information that we'd have there. Having the flow graph or
        // just any more information about variable liveness is necessary to determine that the load
        // instructions between jumps can be safely skipped.
        // The general case where this would be useful, on a higher level, is where a long statement
        // containing many branches returns a value; the branching here can put the result into some
        // different stacksym at each level, meaning that there'd be a load between each branch. The
        // result is that we don't currently optimize it.
        IR::BranchInstr *branchAtTarget = nullptr;
        if (targetInstrNext->IsBranchInstr())
        {
            branchAtTarget = targetInstrNext->AsBranchInstr();
        }
        else
        {
            // We don't have the information here to decide whether or not to continue the branch chain.
            break;
        }
        // This used to just be a targetInstrNext->AsBranchInstr()->IsUnconditional(), but, in order
        // to optimize further, it became necessary to handle more than just unconditional jumps. In
        // order to keep the code relatively clean, the "is it an inherently-taken jump chain" check
        // code now follows here:
        if (!targetInstrNext->AsBranchInstr()->IsUnconditional())
        {
            bool safetofollow = false;
            if(targetInstrNext->m_opcode == branchInstr->m_opcode)
            {
                // If it's the same branch instruction, with the same arguments, the branch decision should,
                // similarly, be the same. There's a bit more that can be done with this (e.g. for inverted,
                // but otherwise similar instructions like brTrue and brFalse, the destination could go down
                // the other path), but this is something that should probably be done more generally, so we
                // can optimize branch chains that have other interesting bechaviors.
                if (
                    (
                        (branchInstr->GetSrc1() && targetInstrNext->GetSrc1() && branchInstr->GetSrc1()->IsEqual(targetInstrNext->GetSrc1())) ||
                        !(branchInstr->GetSrc1() || targetInstrNext->GetSrc1())
                    ) && (
                        (branchInstr->GetSrc2() && targetInstrNext->GetSrc2() && branchInstr->GetSrc2()->IsEqual(targetInstrNext->GetSrc2())) ||
                        !(branchInstr->GetSrc2() || targetInstrNext->GetSrc2())
                    )
                   )
                {
                    safetofollow = true;
                }
            }
            if (!safetofollow)
            {
                // We can't say safely that this branch is something that we can implicitly take, so instead
                // cut off the branch chain optimization here.
                break;
            }
        }

        // We don't want to skip the loop entry, unless we're right before the encoder
        if (targetInstr->m_isLoopTop && !branchAtTarget->IsLowered())
        {
            break;
        }

        if (targetInstr->m_isLoopTop)
        {
            if (targetInstr == lastLoopTop)
            {
                // We are back to a loopTop already visited.
                // Looks like an infinite loop somewhere...
                break;
            }
            lastLoopTop = targetInstr;
        }
#if DBG
        if (!branchInstr->IsMultiBranch() && branchInstr->GetTarget()->m_noHelperAssert && !branchAtTarget->IsMultiBranch())
        {
            branchAtTarget->GetTarget()->m_noHelperAssert = true;
        }

        AssertMsg(++counter < 10000, "We should not be looping this many times!");
#endif

        IR::LabelInstr * reTargetLabel = branchAtTarget->GetTarget();
        AnalysisAssert(reTargetLabel);
        if (targetInstr == reTargetLabel)
        {
            // Infinite loop.
            //    JCC $L1
            // L1:
            //    JMP $L1
            break;
        }

        if(branchInstr->IsMultiBranch())
        {
            IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();
            multiBranchInstr->ChangeLabelRef(targetInstr, reTargetLabel);
        }
        else
        {
            branchInstr->SetTarget(reTargetLabel);
        }

        if (targetInstr->IsUnreferenced())
        {
            Peeps::PeepUnreachableLabel(targetInstr, false);
        }

        targetInstr = reTargetLabel;
        targetInstrNext = targetInstr->GetNextRealInstr();
    }
    return targetInstr;
}